

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTexCubeCase::iterate(UploadTexCubeCase *this)

{
  glBindTextureFunc p_Var1;
  glBindRenderbufferFunc p_Var2;
  glBindFramebufferFunc p_Var3;
  glFramebufferRenderbufferFunc p_Var4;
  TestContext *testCtx;
  int iVar5;
  deUint32 dVar6;
  GLenum err;
  RenderContext *context;
  undefined4 extraout_var;
  PixelBufferAccess *access;
  ConstPixelBufferAccess *src;
  reference pvVar7;
  char *description;
  PixelFormat local_5c8;
  TextureCubeView local_5b8;
  ConstPixelBufferAccess local_580;
  Vector<int,_3> local_554;
  Vector<int,_3> local_548;
  Vector<int,_4> local_53c;
  tcu local_52c [8];
  float afStack_524 [2];
  Vector<bool,_4> local_519;
  undefined1 local_515;
  undefined1 local_514 [7];
  bool compareOk;
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  Sampler local_4c8;
  undefined1 local_48c [8];
  ReferenceParams sampleParams;
  undefined1 local_3f0 [8];
  TextureCube redTex;
  CubeFace local_260;
  int faceNdx_1;
  Vector<float,_2> local_254;
  int local_24c;
  CubeFace local_248;
  int stencilVal;
  CubeFace face;
  int faceNdx;
  undefined1 local_238 [8];
  TextureLevel result;
  undefined1 local_208 [8];
  TextureCube texData;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  undefined1 local_60 [8];
  Framebuffer fbo;
  vector<float,_std::allocator<float>_> texCoord;
  int renderHeight;
  int renderWidth;
  int size;
  Functions *gl;
  RenderContext *renderCtx;
  UploadTexCubeCase *this_local;
  Functions *gl_00;
  
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*context->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar5);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&fbo.super_ObjectWrapper.m_object);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_60,context);
  glu::TypedObjectWrapper<(glu::ObjectType)2>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&depthStencilTex.super_ObjectWrapper.m_object
             ,context);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)(texData.m_view.m_levels + 5),context);
  result.m_data.m_cap = (size_t)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureCube::TextureCube((TextureCube *)local_208,(TextureFormat *)&result.m_data.m_cap,0x40)
  ;
  tcu::TextureFormat::TextureFormat((TextureFormat *)&face,RGBA,UNORM_INT8);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_238,(TextureFormat *)&face,0x80,0x80,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  for (stencilVal = 0; stencilVal < 6; stencilVal = stencilVal + 1) {
    local_248 = stencilVal;
    local_24c = stencilVal * 0x2a;
    tcu::TextureCube::allocLevel((TextureCube *)local_208,stencilVal,0);
    access = tcu::TextureCube::getLevelFace((TextureCube *)local_208,0,local_248);
    tcu::clearStencil(access,local_24c);
  }
  tcu::Vector<float,_2>::Vector(&local_254,-1.5,-1.3);
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&stack0xfffffffffffffda4,1.3,1.4);
  glu::TextureTestUtil::computeQuadTexCoordCube
            ((vector<float,_std::allocator<float>_> *)&fbo.super_ObjectWrapper.m_object,
             CUBEFACE_NEGATIVE_X,&local_254,(Vec2 *)&stack0xfffffffffffffda4);
  p_Var1 = gl_00->bindTexture;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)(texData.m_view.m_levels + 5));
  (*p_Var1)(0x8513,dVar6);
  (*gl_00->texStorage2D)(0x8513,1,this->m_format,0x40,0x40);
  for (local_260 = CUBEFACE_NEGATIVE_X; (int)local_260 < 6;
      local_260 = local_260 + CUBEFACE_POSITIVE_X) {
    dVar6 = glu::getGLCubeFace(local_260);
    src = &tcu::TextureCube::getLevelFace((TextureCube *)local_208,0,local_260)->
           super_ConstPixelBufferAccess;
    glu::texSubImage2D(context,dVar6,0,0,0,src);
  }
  err = (*gl_00->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x2b9);
  p_Var2 = gl_00->bindRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&depthStencilTex.super_ObjectWrapper.m_object);
  (*p_Var2)(0x8d41,dVar6);
  (*gl_00->renderbufferStorage)(0x8d41,0x8058,0x80,0x80);
  p_Var3 = gl_00->bindFramebuffer;
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_60);
  (*p_Var3)(0x8d40,dVar6);
  p_Var4 = gl_00->framebufferRenderbuffer;
  dVar6 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)&depthStencilTex.super_ObjectWrapper.m_object);
  (*p_Var4)(0x8d40,0x8ce0,0x8d41,dVar6);
  checkFramebufferStatus(gl_00);
  dVar6 = glu::ObjectWrapper::operator*((ObjectWrapper *)(texData.m_view.m_levels + 5));
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&fbo.super_ObjectWrapper.m_object,0);
  blitStencilToColorCube(context,dVar6,pvVar7,0x80,0x80);
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)(redTex.m_view.m_levels + 5),(TextureLevel *)local_238);
  glu::readPixels(context,0,0,(PixelBufferAccess *)(redTex.m_view.m_levels + 5));
  tcu::TextureFormat::TextureFormat((TextureFormat *)&sampleParams.baseLevel,R,UNORM_INT8);
  tcu::TextureCube::TextureCube
            ((TextureCube *)local_3f0,(TextureFormat *)&sampleParams.baseLevel,0x40);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&lookupPrec.colorMask,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            (&local_4c8,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,(Vec4 *)&lookupPrec.colorMask,false,MODE_DEPTH);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_48c,TEXTURETYPE_CUBE,&local_4c8,LODMODE_EXACT);
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_514,RULE_OPENGL);
  tcu::Vector<bool,_4>::Vector(&local_519,true,true,true,true);
  lookupPrec.colorThreshold.m_data[2] = (float)local_519.m_data;
  tcu::Vector<int,_4>::Vector(&local_53c,8,8,8,8);
  tcu::computeFixedPointThreshold(local_52c,&local_53c);
  lookupPrec.uvwBits.m_data._4_8_ = local_52c;
  lookupPrec.colorThreshold.m_data[0] = afStack_524[0];
  lookupPrec.colorThreshold.m_data[1] = afStack_524[1];
  tcu::Vector<int,_3>::Vector(&local_548,0x16,0x16,0x16);
  lookupPrec.coordBits.m_data[0] = local_548.m_data[2];
  lodPrec.derivateBits = local_548.m_data[0];
  lodPrec.lodBits = local_548.m_data[1];
  tcu::Vector<int,_3>::Vector(&local_554,5,5,0);
  lookupPrec.uvwBits.m_data[0] = local_554.m_data[2];
  lookupPrec.coordBits.m_data[1] = local_554.m_data[0];
  lookupPrec.coordBits.m_data[2] = local_554.m_data[1];
  lodPrec.rule = 7;
  stack0xfffffffffffffaf0 = 0x10;
  stencilToUnorm8((TextureCube *)local_208,(TextureCube *)local_3f0);
  testCtx = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_580,(TextureLevel *)local_238);
  tcu::TextureCube::operator_cast_to_TextureCubeView(&local_5b8,(TextureCube *)local_3f0);
  pvVar7 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)&fbo.super_ObjectWrapper.m_object,0);
  tcu::PixelFormat::PixelFormat(&local_5c8,8,8,8,8);
  local_515 = glu::TextureTestUtil::verifyTextureResult
                        (testCtx,&local_580,&local_5b8,pvVar7,(ReferenceParams *)local_48c,
                         (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_514,
                         &local_5c8);
  description = "Image comparison failed";
  if ((bool)local_515) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_515 & QP_TEST_RESULT_FAIL,description);
  tcu::TextureCube::~TextureCube((TextureCube *)local_3f0);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_238);
  tcu::TextureCube::~TextureCube((TextureCube *)local_208);
  glu::TypedObjectWrapper<(glu::ObjectType)0>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)0> *)(texData.m_view.m_levels + 5));
  glu::TypedObjectWrapper<(glu::ObjectType)2>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)2> *)&depthStencilTex.super_ObjectWrapper.m_object
            );
  glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)local_60);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&fbo.super_ObjectWrapper.m_object);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					size				= 64;
		const int					renderWidth			= 128;
		const int					renderHeight		= 128;
		vector<float>				texCoord;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		tcu::TextureCube			texData				(glu::mapGLInternalFormat(m_format), size);
		tcu::TextureLevel			result				(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), renderWidth, renderHeight);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
			const int				stencilVal	= 42*faceNdx;

			texData.allocLevel(face, 0);
			tcu::clearStencil(texData.getLevelFace(0, face), stencilVal);
		}

		glu::TextureTestUtil::computeQuadTexCoordCube(texCoord, tcu::CUBEFACE_NEGATIVE_X, Vec2(-1.5f, -1.3f), Vec2(1.3f, 1.4f));

		gl.bindTexture(GL_TEXTURE_CUBE_MAP, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1, m_format, size, size);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
			glu::texSubImage2D(renderCtx, glu::getGLCubeFace(tcu::CubeFace(faceNdx)), 0, 0, 0, texData.getLevelFace(0, tcu::CubeFace(faceNdx)));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, renderWidth, renderHeight);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColorCube(renderCtx, *depthStencilTex, &texCoord[0], renderWidth, renderHeight);
		glu::readPixels(renderCtx, 0, 0, result);

		{
			using namespace glu::TextureTestUtil;

			tcu::TextureCube		redTex			(TextureFormat(TextureFormat::R, TextureFormat::UNORM_INT8), size);
			const ReferenceParams	sampleParams	(TEXTURETYPE_CUBE, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::NEAREST,
																					tcu::Sampler::NEAREST));
			tcu::LookupPrecision	lookupPrec;
			tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
			bool					compareOk;

			lookupPrec.colorMask		= tcu::BVec4(true, true, true, true);
			lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(IVec4(8, 8, 8, 8));
			lookupPrec.coordBits		= tcu::IVec3(22, 22, 22);
			lookupPrec.uvwBits			= tcu::IVec3(5, 5, 0);
			lodPrec.lodBits				= 7;
			lodPrec.derivateBits		= 16;

			stencilToUnorm8(texData, redTex);

			compareOk = verifyTextureResult(m_testCtx, result, redTex, &texCoord[0], sampleParams, lookupPrec, lodPrec, tcu::PixelFormat(8, 8, 8, 8));

			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}